

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# beagle_BeagleJNIWrapper.cpp
# Opt level: O0

jobjectArray Java_beagle_BeagleJNIWrapper_getResourceList(JNIEnv *env,jobject obj)

{
  long *plVar1;
  jclass clazz;
  jmethodID methodID;
  jmethodID methodID_00;
  jmethodID methodID_01;
  jmethodID methodID_02;
  jobject obj_00;
  jstring utf;
  JNIEnv_ *in_RDI;
  jstring jString;
  jobject resourceObj;
  int i;
  jobjectArray resourceArray;
  jmethodID setFlagsMethodID;
  jmethodID setDescriptionID;
  jmethodID setNameMethodID;
  jmethodID constructorMethodID;
  jclass objClass;
  BeagleResourceList *rl;
  jstring in_stack_ffffffffffffff98;
  jclass in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa8;
  jsize in_stack_ffffffffffffffac;
  uint uVar2;
  JNIEnv_ *in_stack_ffffffffffffffb0;
  jobjectArray local_8;
  
  plVar1 = (long *)beagleGetResourceList();
  if (plVar1 == (long *)0x0) {
    local_8 = (jobjectArray)0x0;
  }
  else {
    clazz = JNIEnv_::FindClass((JNIEnv_ *)in_stack_ffffffffffffffa0,
                               (char *)in_stack_ffffffffffffff98);
    if (clazz == (jclass)0x0) {
      printf("NULL returned in FindClass: can\'t find class: beagle/ResourceDetails\n");
      local_8 = (jobjectArray)0x0;
    }
    else {
      methodID = JNIEnv_::GetMethodID
                           (in_stack_ffffffffffffffb0,
                            (jclass)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                            (char *)in_stack_ffffffffffffffa0,(char *)in_stack_ffffffffffffff98);
      if (methodID == (jmethodID)0x0) {
        printf(
              "NULL returned in FindClass: can\'t find constructor for class: beagle/ResourceDetails\n"
              );
        local_8 = (jobjectArray)0x0;
      }
      else {
        methodID_00 = JNIEnv_::GetMethodID
                                (in_stack_ffffffffffffffb0,
                                 (jclass)CONCAT44(in_stack_ffffffffffffffac,
                                                  in_stack_ffffffffffffffa8),
                                 (char *)in_stack_ffffffffffffffa0,(char *)in_stack_ffffffffffffff98
                                );
        if (methodID_00 == (jmethodID)0x0) {
          printf(
                "NULL returned in FindClass: can\'t find \'setName\' method in class: beagle/ResourceDetails\n"
                );
          local_8 = (jobjectArray)0x0;
        }
        else {
          methodID_01 = JNIEnv_::GetMethodID
                                  (in_stack_ffffffffffffffb0,
                                   (jclass)CONCAT44(in_stack_ffffffffffffffac,
                                                    in_stack_ffffffffffffffa8),
                                   (char *)in_stack_ffffffffffffffa0,
                                   (char *)in_stack_ffffffffffffff98);
          if (methodID_01 == (jmethodID)0x0) {
            printf(
                  "NULL returned in FindClass: can\'t find \'setDescription\' method in class: beagle/ResourceDetails\n"
                  );
            local_8 = (jobjectArray)0x0;
          }
          else {
            methodID_02 = JNIEnv_::GetMethodID
                                    (in_stack_ffffffffffffffb0,
                                     (jclass)CONCAT44(in_stack_ffffffffffffffac,
                                                      in_stack_ffffffffffffffa8),
                                     (char *)in_stack_ffffffffffffffa0,
                                     (char *)in_stack_ffffffffffffff98);
            if (methodID_02 == (jmethodID)0x0) {
              printf(
                    "NULL returned in FindClass: can\'t find \'setFlags\' method in class: beagle/ResourceDetails\n"
                    );
              local_8 = (jobjectArray)0x0;
            }
            else {
              local_8 = JNIEnv_::NewObjectArray
                                  (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,
                                   in_stack_ffffffffffffffa0,(jobject)in_stack_ffffffffffffff98);
              for (uVar2 = 0; (int)uVar2 < (int)plVar1[1]; uVar2 = uVar2 + 1) {
                obj_00 = JNIEnv_::NewObject(in_RDI,clazz,methodID,(ulong)uVar2);
                utf = JNIEnv_::NewStringUTF((JNIEnv_ *)obj_00,(char *)in_stack_ffffffffffffff98);
                JNIEnv_::CallVoidMethod(in_RDI,obj_00,methodID_00,utf);
                in_stack_ffffffffffffff98 = JNIEnv_::NewStringUTF((JNIEnv_ *)obj_00,(char *)utf);
                JNIEnv_::CallVoidMethod(in_RDI,obj_00,methodID_01,in_stack_ffffffffffffff98);
                JNIEnv_::CallVoidMethod
                          (in_RDI,obj_00,methodID_02,
                           *(undefined8 *)(*plVar1 + (long)(int)uVar2 * 0x20 + 0x10));
                JNIEnv_::SetObjectArrayElement
                          ((JNIEnv_ *)local_8,
                           (jobjectArray)CONCAT44(uVar2,in_stack_ffffffffffffffa8),
                           (jsize)((ulong)obj_00 >> 0x20),(jobject)in_stack_ffffffffffffff98);
              }
            }
          }
        }
      }
    }
  }
  return local_8;
}

Assistant:

JNIEXPORT jobjectArray JNICALL Java_beagle_BeagleJNIWrapper_getResourceList
  (JNIEnv *env, jobject obj)
{
	BeagleResourceList* rl = beagleGetResourceList();

	if (rl == NULL) {
	    return NULL;
    }

	jclass objClass = env->FindClass("beagle/ResourceDetails");
	if (objClass == NULL) {
		printf("NULL returned in FindClass: can't find class: beagle/ResourceDetails\n");
		return NULL;
	}

	jmethodID constructorMethodID = env->GetMethodID(objClass, "<init>","(I)V");
	if (constructorMethodID == NULL) {
		printf("NULL returned in FindClass: can't find constructor for class: beagle/ResourceDetails\n");
		return NULL;
    }

	jmethodID setNameMethodID = env->GetMethodID(objClass, "setName", "(Ljava/lang/String;)V");
	if (setNameMethodID == NULL) {
		printf("NULL returned in FindClass: can't find 'setName' method in class: beagle/ResourceDetails\n");
		return NULL;
    }

	jmethodID setDescriptionID = env->GetMethodID(objClass, "setDescription", "(Ljava/lang/String;)V");
	if (setDescriptionID == NULL) {
		printf("NULL returned in FindClass: can't find 'setDescription' method in class: beagle/ResourceDetails\n");
		return NULL;
    }

	jmethodID setFlagsMethodID = env->GetMethodID(objClass, "setFlags", "(J)V");
	if (setFlagsMethodID == NULL) {
		printf("NULL returned in FindClass: can't find 'setFlags' method in class: beagle/ResourceDetails\n");
		return NULL;
    }

    jobjectArray resourceArray = env->NewObjectArray(rl->length, objClass, NULL);

	for (int i = 0; i < rl->length; i++) {
	    jobject resourceObj = env->NewObject(objClass, constructorMethodID, i);

	    jstring jString = env->NewStringUTF(rl->list[i].name);
	    env->CallVoidMethod(resourceObj, setNameMethodID, jString);

	    jString = env->NewStringUTF(rl->list[i].description);
    	env->CallVoidMethod(resourceObj, setDescriptionID, jString);

	    env->CallVoidMethod(resourceObj, setFlagsMethodID, rl->list[i].supportFlags);

        env->SetObjectArrayElement(resourceArray, i, resourceObj);
	}

	return resourceArray;
}